

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

TIntermTyped * __thiscall
glslang::HlslParseContext::makeIntegerIndex(HlslParseContext *this,TIntermTyped *index)

{
  TIntermediate *this_00;
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TType local_b8;
  
  iVar1 = (*(index->super_TIntermNode)._vptr_TIntermNode[0x1e])(index);
  uVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x38))
                    ((long *)CONCAT44(extraout_var,iVar1));
  iVar1 = (*(index->super_TIntermNode)._vptr_TIntermNode[0x1e])(index);
  iVar1 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x60))
                    ((long *)CONCAT44(extraout_var_00,iVar1));
  if ((uVar2 & 0xfffffffc) != 8) {
    this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    TType::TType(&local_b8,EbtUint,EvqTemporary,iVar1,0,0,false);
    index = TIntermediate::addConversion(this_00,EOpConstructUint,&local_b8,index);
  }
  return index;
}

Assistant:

TIntermTyped* HlslParseContext::makeIntegerIndex(TIntermTyped* index)
{
    const TBasicType indexBasicType = index->getType().getBasicType();
    const int vecSize = index->getType().getVectorSize();

    // We can use int types directly as the index
    if (indexBasicType == EbtInt || indexBasicType == EbtUint ||
        indexBasicType == EbtInt64 || indexBasicType == EbtUint64)
        return index;

    // Cast index to unsigned integer if it isn't one.
    return intermediate.addConversion(EOpConstructUint, TType(EbtUint, EvqTemporary, vecSize), index);
}